

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O2

bool __thiscall
deqp::gles31::Functional::anon_unknown_1::OneMinusTessCoordComponentCase::checkTessCoordComponent
          (OneMinusTessCoordComponentCase *this,float component)

{
  ostringstream *this_00;
  MessageBuilder local_190;
  
  if ((component != 1.0) || (NAN(component))) {
    local_190.m_log =
         ((this->super_TessCoordComponentInvarianceCase).super_TestCase.super_TestCase.
          super_TestNode.m_testCtx)->m_log;
    this_00 = &local_190.m_str;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
    std::operator<<((ostream *)this_00,
                    "Failure: comp + (1.0-comp) doesn\'t equal 1.0 for some component of tessellation coordinate"
                   );
    tcu::MessageBuilder::operator<<(&local_190,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  }
  return (bool)(-(component == 1.0) & 1);
}

Assistant:

virtual bool checkTessCoordComponent (float component) const
	{
		if (component != 1.0f)
		{
			m_testCtx.getLog() << TestLog::Message << "Failure: comp + (1.0-comp) doesn't equal 1.0 for some component of tessellation coordinate" << TestLog::EndMessage;
			return false;
		}
		return true;
	}